

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void luaX_setinput(lua_State *L,LexState *ls,ZIO *z,TString *source)

{
  size_t sVar1;
  Mbuffer *pMVar2;
  ZIO *z_00;
  byte *pbVar3;
  uint uVar4;
  char *pcVar5;
  
  ls->decpoint = '.';
  ls->L = L;
  (ls->lookahead).token = 0x11f;
  ls->z = z;
  ls->fs = (FuncState *)0x0;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->source = source;
  pcVar5 = (char *)luaM_realloc_(L,ls->buff->buffer,ls->buff->buffsize,0x20);
  pMVar2 = ls->buff;
  pMVar2->buffer = pcVar5;
  pMVar2->buffsize = 0x20;
  z_00 = ls->z;
  sVar1 = z_00->n;
  z_00->n = z_00->n - 1;
  if (sVar1 == 0) {
    uVar4 = luaZ_fill(z_00);
  }
  else {
    pbVar3 = (byte *)z_00->p;
    z_00->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  return;
}

Assistant:

void luaX_setinput (lua_State *L, LexState *ls, ZIO *z, TString *source) {
  ls->decpoint = '.';
  ls->L = L;
  ls->lookahead.token = TK_EOS;  /* no look-ahead token */
  ls->z = z;
  ls->fs = NULL;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->source = source;
  luaZ_resizebuffer(ls->L, ls->buff, LUA_MINBUFFER);  /* initialize buffer */
  next(ls);  /* read first char */
}